

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::close_connection(session_impl *this,peer_connection *p)

{
  bool bVar1;
  long lVar2;
  _Self local_38;
  _Self local_30;
  iterator i;
  shared_ptr<libtorrent::aux::peer_connection> sp;
  peer_connection *p_local;
  session_impl *this_local;
  
  peer_connection::self((peer_connection *)&i);
  local_30._M_node =
       (_Base_ptr)
       ::std::
       set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
       ::find(&this->m_connections,(key_type *)&i);
  local_38._M_node =
       (_Base_ptr)
       ::std::
       set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
       ::end(&this->m_connections);
  bVar1 = ::std::operator!=(&local_30,&local_38);
  if (bVar1) {
    ::std::
    set<std::shared_ptr<libtorrent::aux::peer_connection>,std::less<std::shared_ptr<libtorrent::aux::peer_connection>>,std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>>>
    ::erase_abi_cxx11_((set<std::shared_ptr<libtorrent::aux::peer_connection>,std::less<std::shared_ptr<libtorrent::aux::peer_connection>>,std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>>>
                        *)&this->m_connections,(const_iterator)local_30._M_node);
    lVar2 = ::std::__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::
            use_count((__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                      &i);
    if (2 < lVar2) {
      ::std::
      vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
      ::push_back(&this->m_undead_peers,(value_type *)&i);
    }
  }
  ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::peer_connection> *)&i);
  return;
}

Assistant:

void session_impl::close_connection(peer_connection* p) noexcept
	{
		TORRENT_ASSERT(is_single_thread());
		std::shared_ptr<peer_connection> sp(p->self());

		TORRENT_ASSERT(p->is_disconnecting());

		auto const i = m_connections.find(sp);
		// make sure the next disk peer round-robin cursor stays valid
		if (i != m_connections.end())
		{
			m_connections.erase(i);

			TORRENT_ASSERT(std::find(m_undead_peers.begin()
				, m_undead_peers.end(), sp) == m_undead_peers.end());

			// someone else is holding a reference, it's important that
			// it's destructed from the network thread. Make sure the
			// last reference is held by the network thread.
			TORRENT_ASSERT_VAL(m_undead_peers.capacity() > m_undead_peers.size()
				, m_undead_peers.capacity());
			if (sp.use_count() > 2)
				m_undead_peers.push_back(sp);
		}
	}